

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

QString * __thiscall
QXmlStreamReader::readElementText(QXmlStreamReader *this,ReadElementTextBehaviour behaviour)

{
  long lVar1;
  QStringView v;
  bool bVar2;
  TokenType TVar3;
  QXmlStreamReaderPrivate *this_00;
  const_pointer i;
  QString *this_01;
  int in_EDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QXmlStreamReaderPrivate *d;
  QString *result;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  Error in_stack_ffffffffffffff24;
  QChar *in_stack_ffffffffffffff28;
  QStringView *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff50;
  QString *this_02;
  undefined4 in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  this_00 = d_func((QXmlStreamReader *)0x64a50f);
  bVar2 = isStartElement((QXmlStreamReader *)0x64a51e);
  if (bVar2) {
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x64a556);
    do {
      TVar3 = readNext((QXmlStreamReader *)this_02);
      this_01 = (QString *)(ulong)(TVar3 - StartElement);
      switch(this_01) {
      case (QString *)0x0:
        if (in_EDX == 2) {
          skipCurrentElement((QXmlStreamReader *)in_stack_ffffffffffffff30);
          break;
        }
        if (in_EDX == 1) {
          readElementText((QXmlStreamReader *)CONCAT44(1,in_stack_ffffffffffffff90),
                          (ReadElementTextBehaviour)((ulong)this_00 >> 0x20));
          QString::operator+=((QString *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              (QString *)
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          QString::~QString((QString *)0x64a6bd);
          break;
        }
      default:
        if ((this_00->error != NoError) || (in_EDX == 0)) goto LAB_0064a703;
        break;
      case (QString *)0x1:
        goto LAB_0064a7c2;
      case (QString *)0x2:
      case (QString *)0x5:
        in_stack_ffffffffffffff30 = (QStringView *)QString::size(in_RDI);
        i = std::data<QtPrivate::XmlStringRef>((XmlStringRef *)0x64a5f6);
        QtPrivate::lengthHelperContainer<QtPrivate::XmlStringRef>((XmlStringRef *)0x64a608);
        QStringView::QStringView<QChar,_true>
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        v.m_size._4_4_ = TVar3;
        v.m_size._0_4_ = in_stack_ffffffffffffff50;
        v.m_data = (storage_type_conflict *)in_RDI;
        QString::insert(this_01,(qsizetype)i,v);
        break;
      case (QString *)0x3:
      case (QString *)0x6:
      }
    } while( true );
  }
  QString::QString((QString *)0x64a7c2);
LAB_0064a7c2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_02;
LAB_0064a703:
  if (this_00->error == NoError) {
    QXmlStream::tr((char *)this_00,
                   (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c);
    QXmlStreamReaderPrivate::raiseError
              (this_00,in_stack_ffffffffffffff24,
               (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QString::~QString((QString *)0x64a760);
  }
  goto LAB_0064a7c2;
}

Assistant:

QString QXmlStreamReader::readElementText(ReadElementTextBehaviour behaviour)
{
    Q_D(QXmlStreamReader);
    if (isStartElement()) {
        QString result;
        forever {
            switch (readNext()) {
            case Characters:
            case EntityReference:
                result.insert(result.size(), d->text);
                break;
            case EndElement:
                return result;
            case ProcessingInstruction:
            case Comment:
                break;
            case StartElement:
                if (behaviour == SkipChildElements) {
                    skipCurrentElement();
                    break;
                } else if (behaviour == IncludeChildElements) {
                    result += readElementText(behaviour);
                    break;
                }
                Q_FALLTHROUGH();
            default:
                if (d->error || behaviour == ErrorOnUnexpectedElement) {
                    if (!d->error)
                        d->raiseError(UnexpectedElementError, QXmlStream::tr("Expected character data."));
                    return result;
                }
            }
        }